

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcr.c
# Opt level: O1

void doreclaim(void)

{
  int iVar1;
  int iVar2;
  
  if (*GcDisabled_word != 0) {
    return;
  }
  update_miscstats();
  iVar1 = MiscStats->totaltime;
  iVar2 = MiscStats->swapwaittime;
  *Reclaim_cnt_word = 0;
  if (*GcMess_word != 0) {
    flip_cursor();
  }
  dogc01();
  if (*GcMess_word != 0) {
    flip_cursor();
  }
  *Reclaim_cnt_word = *ReclaimMin_word;
  update_miscstats();
  MiscStats->gctime =
       (MiscStats->gctime - (iVar2 + iVar1)) + MiscStats->totaltime + MiscStats->swapwaittime;
  return;
}

Assistant:

void doreclaim(void) {
  MISCSTATS gcmisc;

  if (*GcDisabled_word == NIL) {
    update_miscstats();
    gcmisc = *((MISCSTATS *)MiscStats);
    *Reclaim_cnt_word = NIL;
    if (*GcMess_word != NIL) flip_cursor();
    dogc01();
    if (*GcMess_word != NIL) flip_cursor();
    *Reclaim_cnt_word = *ReclaimMin_word;
    update_miscstats();
    MiscStats->gctime = MiscStats->gctime + MiscStats->totaltime - gcmisc.totaltime +
                        MiscStats->swapwaittime - gcmisc.swapwaittime;
  }
}